

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O1

void __thiscall xe::TcpIpRecvThread::stop(TcpIpRecvThread *this)

{
  deUint32 dVar1;
  Error *this_00;
  
  if (this->m_isRunning == true) {
    dVar1 = deSocket_getOpenChannels(this->m_socket->m_socket);
    if ((dVar1 & 1) != 0) {
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,(char *)0x0,"!m_socket.isReceiveOpen()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x163);
      __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
    }
    de::Thread::join(&this->super_Thread);
    this->m_isRunning = false;
  }
  return;
}

Assistant:

void TcpIpRecvThread::stop (void)
{
	if (m_isRunning)
	{
		// \note Socket must be closed before terminating receive thread.
		XE_CHECK(!m_socket.isReceiveOpen());

		join();
		m_isRunning = false;
	}
}